

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionUtils.cpp
# Opt level: O0

double DIS::ConversionUtils::getRollFromEuler
                 (double lat,double lon,double psi,double theta,double phi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double b33;
  double b23;
  double cosPhiSinTheta;
  double sinPhiSinTheta;
  double cosPhi;
  double sinPhi;
  double sinPsi;
  double cosPsi;
  double sinTheta;
  double cosTheta;
  double cosLatSinLon;
  double cosLatCosLon;
  double coslat;
  double coslon;
  double sinlon;
  double sinlat;
  double phi_local;
  double theta_local;
  double psi_local;
  double lon_local;
  double lat_local;
  
  dVar1 = sin(lat);
  dVar2 = sin(lon);
  dVar3 = cos(lon);
  dVar4 = cos(lat);
  dVar5 = cos(theta);
  dVar6 = sin(theta);
  dVar7 = cos(psi);
  dVar8 = sin(psi);
  dVar9 = sin(phi);
  dVar10 = cos(phi);
  dVar1 = atan2(-(dVar1 * dVar9 * dVar5 +
                 dVar4 * dVar3 * (-dVar10 * dVar8 + dVar9 * dVar6 * dVar7) +
                 dVar4 * dVar2 * (dVar10 * dVar7 + dVar9 * dVar6 * dVar8)),
                -(dVar1 * dVar10 * dVar5 +
                 dVar4 * dVar3 * (dVar9 * dVar8 + dVar10 * dVar6 * dVar7) +
                 dVar4 * dVar2 * (-dVar9 * dVar7 + dVar10 * dVar6 * dVar8)));
  dVar1 = radToDeg(dVar1);
  return dVar1;
}

Assistant:

double ConversionUtils::getRollFromEuler(double lat, double lon, double psi, double theta, double phi)
{
    double sinlat = sin(lat);
    double sinlon = sin(lon);
    double coslon = cos(lon);
    double coslat = cos(lat);
    double cosLatCosLon = coslat * coslon;
    double cosLatSinLon = coslat * sinlon;

    double cosTheta = cos(theta);
    double sinTheta = sin(theta);
    double cosPsi = cos(psi);
    double sinPsi = sin(psi);
    double sinPhi = sin(phi);
    double cosPhi = cos(phi);

    double sinPhiSinTheta = sinPhi * sinTheta;
    double cosPhiSinTheta = cosPhi * sinTheta;

    double b23 = cosLatCosLon * (-cosPhi * sinPsi + sinPhiSinTheta * cosPsi)
                 + cosLatSinLon * (cosPhi * cosPsi + sinPhiSinTheta * sinPsi)
                 + sinlat * (sinPhi * cosTheta);

    double b33 = cosLatCosLon * (sinPhi * sinPsi + cosPhiSinTheta * cosPsi)
                 + cosLatSinLon * (-sinPhi * cosPsi + cosPhiSinTheta * sinPsi)
                 + sinlat * (cosPhi * cosTheta);

    return radToDeg(atan2(-b23, -b33));
}